

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O2

void trico_compress_double_precision
               (uint32_t *nr_of_compressed_bytes,uint8_t **out,double *input,
               uint32_t number_of_doubles,uint64_t hash1_size_exponent,uint64_t hash2_size_exponent)

{
  double dVar1;
  double dVar2;
  void *pvVar3;
  uint8_t **ppuVar4;
  byte *pbVar5;
  double dVar6;
  ulong uVar7;
  uint8_t *puVar8;
  double dVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t __nmemb;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  size_t __nmemb_00;
  ulong uVar16;
  ulong uVar17;
  uint64_t uStack_f0;
  uint64_t bcode [2];
  byte *local_c8;
  void *local_c0;
  void *local_b8;
  uint32_t *local_b0;
  uint8_t **local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  double *local_70;
  ulong local_68;
  ulong local_60;
  uint64_t xor2 [2];
  uint64_t xor1 [2];
  
  uVar7 = hash1_size_exponent & 0xfffffffffffffffe;
  if (0x1d < (hash1_size_exponent & 0xfffffffffffffffe)) {
    uVar7 = 0x1e;
  }
  uVar11 = hash2_size_exponent & 0xfffffffffffffffe;
  if (0x1d < (hash2_size_exponent & 0xfffffffffffffffe)) {
    uVar11 = 0x1e;
  }
  local_b0 = nr_of_compressed_bytes;
  local_70 = input;
  pbVar5 = (byte *)malloc((ulong)((number_of_doubles & 1) +
                                 (number_of_doubles >> 1) + number_of_doubles * 8));
  __nmemb = 1L << ((byte)uVar7 & 0x3f);
  __nmemb_00 = 1L << ((byte)uVar11 & 0x3f);
  *out = pbVar5;
  local_78 = __nmemb - 1;
  local_80 = __nmemb_00 - 1;
  local_a8 = out;
  local_b8 = calloc(__nmemb,8);
  local_c0 = calloc(__nmemb_00,8);
  local_98 = uVar11 >> 1 & 0x7fffffff;
  *pbVar5 = (byte)local_98 | (byte)uVar7 * '\b';
  pbVar5[1] = (byte)(number_of_doubles >> 0x18);
  pbVar5[2] = (byte)(number_of_doubles >> 0x10);
  pbVar5[3] = (byte)(number_of_doubles >> 8);
  local_c8 = pbVar5 + 5;
  pbVar5[4] = (byte)number_of_doubles;
  local_90 = 0x40 - uVar7;
  local_88 = 0x40 - uVar11;
  local_60 = (ulong)number_of_doubles;
  uVar11 = 0;
  uVar17 = 0;
  uVar14 = 0;
  lVar12 = 0;
  uVar16 = 0;
  dVar6 = 0.0;
  dVar9 = 0.0;
  local_68 = uVar7;
  do {
    pvVar3 = local_c0;
    if ((uint)local_60 == (uint)uVar11) {
      if ((int)uVar16 == 0) {
        bcode[1] = 1;
        xor1[1] = 0;
        trico_fill_code_double(&local_c8,xor1,xor2,bcode);
      }
      ppuVar4 = local_a8;
      puVar8 = *local_a8;
      uVar15 = (int)local_c8 - (int)puVar8;
      *local_b0 = uVar15;
      free(local_b8);
      free(local_c0);
      puVar8 = (uint8_t *)realloc(puVar8,(ulong)uVar15);
      *ppuVar4 = puVar8;
      return;
    }
    uVar15 = (uint)uVar11 & 1;
    uVar16 = (ulong)uVar15;
    dVar1 = local_70[uVar11];
    *(double *)((long)local_b8 + uVar17 * 8) = dVar1;
    uVar13 = (ulong)dVar1 ^ (ulong)dVar9;
    uVar10 = (ulong)(uVar15 * 8);
    *(ulong *)((long)xor1 + uVar10) = uVar13;
    uVar17 = (uVar17 << ((byte)local_68 & 0x3f) ^ (ulong)dVar1 >> ((byte)local_90 & 0x3f)) &
             local_78;
    *(long *)((long)local_c0 + uVar14 * 8) = (long)dVar1 - (long)dVar6;
    dVar2 = *(double *)((long)local_b8 + uVar17 * 8);
    uVar7 = lVar12 + (long)dVar6 ^ (ulong)dVar1;
    *(ulong *)((long)xor2 + uVar10) = uVar7;
    uVar14 = (uVar14 << ((byte)local_98 & 0x3f) ^
             (ulong)((long)dVar1 - (long)dVar6) >> ((byte)local_88 & 0x3f)) & local_80;
    *(undefined8 *)((long)bcode + uVar10) = 8;
    lVar12 = *(long *)((long)pvVar3 + uVar14 * 8);
    if (dVar1 == dVar9) {
      uStack_f0 = 0;
LAB_00107123:
      bcode[uVar16] = uStack_f0;
    }
    else {
      uStack_f0 = 1;
      if (uVar13 < 0x100) goto LAB_00107123;
      if (uVar13 < 0x10000) {
        uStack_f0 = 2;
        if (uVar7 < 0x100) {
          uStack_f0 = 9;
        }
        goto LAB_00107123;
      }
      if (0xffffff < uVar13) {
        if (uVar13 >> 0x20 == 0) {
          bcode[uVar16] = 4;
          uStack_f0 = 9;
          if (((0xff < uVar7) && (uStack_f0 = 10, 0xffff < uVar7)) &&
             (uStack_f0 = 0xb, 0xffffff < uVar7)) goto LAB_00107127;
        }
        else if (uVar13 >> 0x28 == 0) {
          bcode[uVar16] = 5;
          uStack_f0 = 9;
          if (((0xff < uVar7) && (uStack_f0 = 10, 0xffff < uVar7)) &&
             ((uStack_f0 = 0xb, 0xffffff < uVar7 && (uStack_f0 = 0xc, uVar7 >> 0x20 != 0))))
          goto LAB_00107127;
        }
        else if (uVar13 >> 0x30 == 0) {
          bcode[uVar16] = 6;
          uStack_f0 = 9;
          if ((((0xff < uVar7) && (uStack_f0 = 10, 0xffff < uVar7)) &&
              (uStack_f0 = 0xb, 0xffffff < uVar7)) && (uStack_f0 = 0xc, uVar7 >> 0x20 != 0)) {
            uStack_f0 = 0xd;
            uVar10 = 0x10000000000;
            goto LAB_00107286;
          }
        }
        else if (uVar13 >> 0x38 == 0) {
          bcode[uVar16] = 7;
          uStack_f0 = 9;
          if (((0xff < uVar7) && (uStack_f0 = 10, 0xffff < uVar7)) &&
             ((uStack_f0 = 0xb, 0xffffff < uVar7 &&
              ((uStack_f0 = 0xc, uVar7 >> 0x20 != 0 && (uStack_f0 = 0xd, 0xffffffffff < uVar7))))))
          {
            uStack_f0 = 0xe;
            uVar10 = 0x1000000000000;
LAB_00107286:
            if (uVar10 <= uVar7) goto LAB_00107127;
          }
        }
        else {
          uStack_f0 = 9;
          if (((((0xff < uVar7) && (uStack_f0 = 10, 0xffff < uVar7)) &&
               (uStack_f0 = 0xb, 0xffffff < uVar7)) &&
              ((uStack_f0 = 0xc, uVar7 >> 0x20 != 0 && (uStack_f0 = 0xd, 0xffffffffff < uVar7)))) &&
             (uStack_f0 = 0xe, 0xffffffffffff < uVar7)) {
            uStack_f0 = 0xf;
            uVar10 = 0x100000000000000;
            goto LAB_00107286;
          }
        }
        goto LAB_00107123;
      }
      bcode[uVar16] = 3;
      uStack_f0 = 9;
      if ((uVar7 < 0x100) || (uStack_f0 = 10, uVar7 < 0x10000)) goto LAB_00107123;
    }
LAB_00107127:
    if ((uVar11 & 1) != 0) {
      local_a0 = lVar12;
      trico_fill_code_double(&local_c8,xor1,xor2,bcode);
      lVar12 = local_a0;
    }
    uVar11 = uVar11 + 1;
    dVar6 = dVar1;
    dVar9 = dVar2;
  } while( true );
}

Assistant:

void trico_compress_double_precision(uint32_t* nr_of_compressed_bytes, uint8_t** out, const double* input, const uint32_t number_of_doubles, uint64_t hash1_size_exponent, uint64_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_doubles) * sizeof(double) + (number_of_doubles) / 2 + (number_of_doubles & 1); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  uint64_t value;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t hash1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction1 = 0;
  uint64_t prediction2 = 0;
  uint64_t xor1[2];
  uint64_t xor2[2];
  uint64_t bcode[2];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_doubles >> 24));
  *p_out++ = (uint8_t)((number_of_doubles >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles) & 0xff);

  for (uint32_t i = 0; i < number_of_doubles; ++i)
    {
    j = i & 1;
    value = *(const uint64_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 8; // 8 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      }
    else if (0 == (xor1[j] >> 32))
      {
      bcode[j] = 4; // 4 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      }
    else if (0 == (xor1[j] >> 40))
      {
      bcode[j] = 5; // 5 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      }
    else if (0 == (xor1[j] >> 48))
      {
      bcode[j] = 6; // 6 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      }
    else if (0 == (xor1[j] >> 56))
      {
      bcode[j] = 7; // 7 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      }
    else // 8 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      else if (0 == (xor2[j] >> 56))
        {
        bcode[j] = 15; // 7 bytes
        }
      }

    if (j == 1)
      {
      trico_fill_code_double(&p_out, xor1, xor2, bcode);
      }
    }
  if (j == 0)
    {
    bcode[1] = 1;
    xor1[1] = 0;
    trico_fill_code_double(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }